

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::is_supported_argument_buffer_type(CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  
  bVar1 = *(int *)&(type->super_IVariant).field_0xc != 0x10;
  return (bool)((((this->msl_options).platform != iOS || bVar1) || (type->image).sampled != 2) &
               (~(this->msl_options).use_framebuffer_fetch_subpasses |
               ((type->image).dim != DimSubpassData || bVar1)));
}

Assistant:

bool CompilerMSL::is_supported_argument_buffer_type(const SPIRType &type) const
{
	// Very specifically, image load-store in argument buffers are disallowed on MSL on iOS.
	// But we won't know when the argument buffer is encoded whether this image will have
	// a NonWritable decoration. So just use discrete arguments for all storage images
	// on iOS.
	bool is_storage_image = type.basetype == SPIRType::Image && type.image.sampled == 2;
	bool is_supported_type = !msl_options.is_ios() || !is_storage_image;
	return !type_is_msl_framebuffer_fetch(type) && is_supported_type;
}